

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O1

SRes Lzma2Dec_DecodeToBuf
               (CLzma2Dec *p,Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,
               ELzmaFinishMode finishMode,ELzmaStatus *status)

{
  SizeT SVar1;
  SizeT SVar2;
  ELzmaFinishMode finishMode_00;
  Byte *pBVar3;
  SRes SVar4;
  SRes unaff_EBX;
  SizeT SVar5;
  SizeT dicLimit;
  size_t __n;
  SizeT srcSizeCur;
  SizeT local_60;
  SizeT *local_58;
  SizeT *local_50;
  SizeT local_48;
  Byte *local_40;
  Byte *local_38;
  
  SVar5 = *destLen;
  local_60 = *srcLen;
  *destLen = 0;
  *srcLen = 0;
  local_58 = destLen;
  local_50 = srcLen;
  while( true ) {
    SVar1 = (p->decoder).dicBufSize;
    if ((p->decoder).dicPos == SVar1) {
      (p->decoder).dicPos = 0;
    }
    SVar2 = (p->decoder).dicPos;
    dicLimit = SVar2 + SVar5;
    if (SVar1 - SVar2 < SVar5) {
      dicLimit = SVar1;
    }
    finishMode_00 = finishMode;
    if (SVar1 - SVar2 < SVar5) {
      finishMode_00 = LZMA_FINISH_ANY;
    }
    local_48 = local_60;
    local_40 = dest;
    local_38 = src;
    SVar4 = Lzma2Dec_DecodeToDic(p,dicLimit,src,&local_60,finishMode_00,status);
    pBVar3 = local_40;
    SVar1 = local_60;
    *local_50 = *local_50 + local_60;
    __n = (p->decoder).dicPos - SVar2;
    memcpy(local_40,(p->decoder).dic + SVar2,__n);
    *local_58 = *local_58 + __n;
    SVar5 = SVar5 - __n;
    if (SVar5 == 0 || __n == 0) {
      unaff_EBX = 0;
    }
    if (SVar4 != 0) break;
    src = local_38 + SVar1;
    local_60 = local_48 - SVar1;
    dest = pBVar3 + __n;
    if (SVar5 == 0 || __n == 0) {
      return unaff_EBX;
    }
  }
  return SVar4;
}

Assistant:

SRes Lzma2Dec_DecodeToBuf(CLzma2Dec *p, Byte *dest, SizeT *destLen, const Byte *src, SizeT *srcLen, ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT outSize = *destLen, inSize = *srcLen;
  *srcLen = *destLen = 0;
  for (;;)
  {
    SizeT srcSizeCur = inSize, outSizeCur, dicPos;
    ELzmaFinishMode curFinishMode;
    SRes res;
    if (p->decoder.dicPos == p->decoder.dicBufSize)
      p->decoder.dicPos = 0;
    dicPos = p->decoder.dicPos;
    if (outSize > p->decoder.dicBufSize - dicPos)
    {
      outSizeCur = p->decoder.dicBufSize;
      curFinishMode = LZMA_FINISH_ANY;
    }
    else
    {
      outSizeCur = dicPos + outSize;
      curFinishMode = finishMode;
    }

    res = Lzma2Dec_DecodeToDic(p, outSizeCur, src, &srcSizeCur, curFinishMode, status);
    src += srcSizeCur;
    inSize -= srcSizeCur;
    *srcLen += srcSizeCur;
    outSizeCur = p->decoder.dicPos - dicPos;
    memcpy(dest, p->decoder.dic + dicPos, outSizeCur);
    dest += outSizeCur;
    outSize -= outSizeCur;
    *destLen += outSizeCur;
    if (res != 0)
      return res;
    if (outSizeCur == 0 || outSize == 0)
      return SZ_OK;
  }
}